

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_add(sexp ctx,sexp a,sexp b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined8 b_00;
  sexp rat;
  undefined8 in_RDX;
  undefined8 in_RSI;
  sexp in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp tmp;
  sexp r;
  int t;
  int bt;
  int at;
  sexp_sint_t sum;
  sexp in_stack_ffffffffffffff68;
  sexp in_stack_ffffffffffffff70;
  sexp f;
  sexp in_stack_ffffffffffffff78;
  sexp in_stack_ffffffffffffff80;
  sexp in_stack_ffffffffffffff88;
  sexp in_stack_ffffffffffffff90;
  sexp ctx_00;
  sexp a_00;
  sexp psVar4;
  undefined8 local_38;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 a_01;
  
  local_24 = sexp_number_type((sexp)in_RSI);
  iVar3 = sexp_number_type((sexp)in_RDX);
  local_38 = &DAT_0000043e;
  psVar4 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffb0,0,0x10);
  ctx_00 = (sexp)&stack0xffffffffffffffc0;
  a_00 = (sexp)(in_RDI->value).context.saves;
  (in_RDI->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffb0;
  local_28 = iVar3;
  a_01 = in_RDX;
  if (iVar3 < (int)local_24) {
    local_38 = in_RSI;
    local_28 = local_24;
    local_24 = iVar3;
    a_01 = in_RSI;
    in_RSI = in_RDX;
  }
  rat = (sexp)(ulong)(uint)(local_28 + local_24 * 6);
  switch(rat) {
  case (sexp)0x0:
  case (sexp)0x1:
  case (sexp)0x2:
  case (sexp)0x3:
  case (sexp)0x4:
  case (sexp)0x5:
    local_38 = sexp_type_exception(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                                   (sexp_uint_t)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
    ;
    break;
  case (sexp)0x7:
    auVar1._8_8_ = (long)in_RSI >> 0x3f;
    auVar1._0_8_ = in_RSI & 0xfffffffffffffffe;
    auVar2._8_8_ = (long)a_01 >> 0x3f;
    auVar2._0_8_ = a_01 & 0xfffffffffffffffe;
    b_00 = SUB168(auVar1 / SEXT816(2),0) + SUB168(auVar2 / SEXT816(2),0);
    if (((long)b_00 < -0x4000000000000000) || (0x3fffffffffffffff < (long)b_00)) {
      sexp_fixnum_to_bignum(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      local_38 = sexp_add((sexp)in_RSI,(sexp)a_01,(sexp)b_00);
    }
    else {
      local_38 = b_00 * 2 | 1;
    }
    break;
  case (sexp)0x8:
    local_38 = a_01;
    if ((sexp)in_RSI != (sexp)&DAT_00000001) {
      local_38 = sexp_make_flonum(in_stack_ffffffffffffff78,(double)in_stack_ffffffffffffff70);
    }
    break;
  case (sexp)0x9:
    sexp_bignum_add_fixnum(psVar4,a_00,ctx_00);
    local_38 = sexp_bignum_normalize(in_stack_ffffffffffffff68);
    break;
  case (sexp)0xa:
  case (sexp)0x16:
    psVar4 = sexp_make_ratio(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                             in_stack_ffffffffffffff70);
  case (sexp)0x1c:
    local_38 = sexp_ratio_add(psVar4,a_00,ctx_00);
    break;
  case (sexp)0xb:
  case (sexp)0x11:
  case (sexp)0x17:
  case (sexp)0x1d:
    psVar4 = sexp_make_complex(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                               in_stack_ffffffffffffff70);
  case (sexp)0x23:
    local_38 = sexp_complex_add(psVar4,a_00,ctx_00);
    break;
  case (sexp)0xe:
    local_38 = sexp_make_flonum(in_stack_ffffffffffffff78,(double)in_stack_ffffffffffffff70);
    break;
  case (sexp)0xf:
    sexp_bignum_to_double(in_RDI);
    local_38 = sexp_make_flonum(in_stack_ffffffffffffff78,(double)in_stack_ffffffffffffff70);
    break;
  case (sexp)0x10:
    psVar4 = (((sexp)in_RSI)->value).type.name;
    f = in_RDI;
    sexp_ratio_to_double(ctx_00,rat);
    local_38 = sexp_make_flonum(psVar4,(double)f);
    break;
  case (sexp)0x15:
    sexp_bignum_add(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                    in_stack_ffffffffffffff78);
    local_38 = sexp_bignum_normalize(in_stack_ffffffffffffff68);
  }
  (in_RDI->value).context.saves = (sexp_gc_var_t *)a_00;
  return (sexp)local_38;
}

Assistant:

sexp sexp_add (sexp ctx, sexp a, sexp b) {
  sexp_sint_t sum;
  int at=sexp_number_type(a), bt=sexp_number_type(b), t;
  sexp r=SEXP_VOID;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);
  if (at > bt) {r=a; a=b; b=r; t=at; at=bt; bt=t;}
  switch ((at * SEXP_NUM_NUMBER_TYPES) + bt) {
  case SEXP_NUM_NOT_NOT: case SEXP_NUM_NOT_FIX:
  case SEXP_NUM_NOT_FLO: case SEXP_NUM_NOT_BIG:
#if SEXP_USE_RATIOS
  case SEXP_NUM_NOT_RAT:
#endif
#if SEXP_USE_COMPLEX
  case SEXP_NUM_NOT_CPX:
#endif
    r = sexp_type_exception(ctx, NULL, SEXP_NUMBER, a);
    break;
  case SEXP_NUM_FIX_FIX:
    sum = sexp_unbox_fixnum(a) + sexp_unbox_fixnum(b);
    if ((sum < SEXP_MIN_FIXNUM) || (sum > SEXP_MAX_FIXNUM))
      r = sexp_add(ctx, tmp=sexp_fixnum_to_bignum(ctx, a), b);
    else
      r = sexp_make_fixnum(sum);
    break;
  case SEXP_NUM_FIX_FLO:
    r = a == SEXP_ZERO ? b : sexp_make_flonum(ctx, sexp_fixnum_to_double(a)+sexp_flonum_value(b));
    break;
  case SEXP_NUM_FIX_BIG:
    r = sexp_bignum_normalize(sexp_bignum_add_fixnum(ctx, b, a));
    break;
  case SEXP_NUM_FLO_FLO:
    r = sexp_fp_add(ctx, a, b);
    break;
  case SEXP_NUM_FLO_BIG:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) + sexp_bignum_to_double(b));
    break;
  case SEXP_NUM_BIG_BIG:
    r = sexp_bignum_normalize(sexp_bignum_add(ctx, NULL, b, a));
    break;
#if SEXP_USE_RATIOS
  case SEXP_NUM_FLO_RAT:
    r = sexp_make_flonum(ctx, sexp_flonum_value(a) + sexp_ratio_to_double(ctx, b));
    break;
  case SEXP_NUM_FIX_RAT:
  case SEXP_NUM_BIG_RAT:
    a = tmp = sexp_make_ratio(ctx, a, SEXP_ONE);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_RAT_RAT:
    r = sexp_ratio_add(ctx, a, b);
    break;
#endif
#if SEXP_USE_COMPLEX
#if SEXP_USE_RATIOS
  case SEXP_NUM_RAT_CPX:
#endif
  case SEXP_NUM_FLO_CPX:
  case SEXP_NUM_FIX_CPX:
  case SEXP_NUM_BIG_CPX:
    a = tmp = sexp_make_complex(ctx, a, SEXP_ZERO);
    /* ... FALLTHROUGH ... */
  case SEXP_NUM_CPX_CPX:
    r = sexp_complex_add(ctx, a, b);
    break;
#endif
  }
  sexp_gc_release1(ctx);
  return r;
}